

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIntegrable.cpp
# Opt level: O2

void __thiscall
chrono::ChIntegrableIIorder::StateIncrement
          (ChIntegrableIIorder *this,ChState *y_new,ChState *y,ChStateDelta *Dy)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ChException *this_00;
  Type local_130;
  ChStateDelta mv_new;
  ChState mx_new;
  ChStateDelta mDv;
  ChStateDelta mDx;
  ChStateDelta mv;
  ChState mx;
  ChStateDelta local_68;
  string local_50;
  
  lVar1 = (y->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  iVar2 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])();
  if (lVar1 == iVar2) {
    (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x1b])(this,y_new,y,Dy);
    return;
  }
  lVar1 = (y->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  iVar2 = (**(this->super_ChIntegrable)._vptr_ChIntegrable)(this);
  if (lVar1 == iVar2) {
    iVar2 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
    ChState::ChState(&mx,(long)iVar2,y->integrable);
    iVar2 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
    ChStateDelta::ChStateDelta(&mv,(long)iVar2,y->integrable);
    iVar2 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((Type *)&local_130,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)y,0,iVar2);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&mx.super_ChVectorDynamic<double>,
               (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_130);
    iVar2 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
    iVar3 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((Type *)&local_130,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)y,
               (long)iVar2,iVar3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&mv.super_ChVectorDynamic<double>,
               (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_130);
    iVar2 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
    ChStateDelta::ChStateDelta(&mDx,(long)iVar2,y->integrable);
    iVar2 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x14])(this);
    ChStateDelta::ChStateDelta(&mDv,(long)iVar2,y->integrable);
    iVar2 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((Type *)&local_130,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)Dy,0,iVar2);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&mDx.super_ChVectorDynamic<double>,
               (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_130);
    iVar2 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
    iVar3 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x14])(this);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((Type *)&local_130,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)Dy,
               (long)iVar2,iVar3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&mDv.super_ChVectorDynamic<double>,
               (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_130);
    iVar2 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
    ChState::ChState(&mx_new,(long)iVar2,y->integrable);
    iVar2 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
    ChStateDelta::ChStateDelta(&mv_new,(long)iVar2,y->integrable);
    (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x1b])(this,&mx_new,&mx,&mDx);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_130,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mDv,(type *)0x0);
    ChStateDelta::operator+(&local_68,&mv,(ChVectorConstRef)&local_130);
    ChStateDelta::operator=(&mv_new,&local_68);
    Eigen::internal::handmade_aligned_free
              (local_68.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (local_130.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
               super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
               m_xpr);
    iVar2 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_130,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)y_new,0,iVar2);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&local_130.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
               &mx_new.super_ChVectorDynamic<double>);
    iVar2 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
    iVar3 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_130,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)y_new,(long)iVar2,
               iVar3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&local_130.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
               &mv_new.super_ChVectorDynamic<double>);
    Eigen::internal::handmade_aligned_free
              (mv_new.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (mx_new.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (mDv.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (mDx.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (mv.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (mx.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    return;
  }
  this_00 = (ChException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_50,"StateIncrement() called with a wrong number of elements",
             (allocator *)&local_130);
  ChException::ChException(this_00,&local_50);
  __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
}

Assistant:

void ChIntegrableIIorder::StateIncrement(ChState& y_new,         // resulting y_new = y + Dy
                                         const ChState& y,       // initial state y
                                         const ChStateDelta& Dy  // state increment Dy
                                         ) {
    if (y.size() == GetNcoords_x()) {
        // Incrementing the x part only, user provided only x  in y={x, dx/dt}
        StateIncrementX(y_new, y, Dy);

        return;
    }

    if (y.size() == GetNcoords_y()) {
        // Incrementing y in y={x, dx/dt}.
        // PERFORMANCE WARNING! temporary vectors allocated on heap.
        // This is only to support compatibility with 1st order integrators.
        ChState mx(GetNcoords_x(), y.GetIntegrable());
        ChStateDelta mv(GetNcoords_v(), y.GetIntegrable());
        mx = y.segment(0, GetNcoords_x());
        mv = y.segment(GetNcoords_x(), GetNcoords_v());

        ChStateDelta mDx(GetNcoords_v(), y.GetIntegrable());
        ChStateDelta mDv(GetNcoords_a(), y.GetIntegrable());
        mDx = Dy.segment(0, GetNcoords_v());
        mDv = Dy.segment(GetNcoords_v(), GetNcoords_a());
        
        ChState mx_new(GetNcoords_x(), y.GetIntegrable());
        ChStateDelta mv_new(GetNcoords_v(), y.GetIntegrable());
        StateIncrementX(mx_new, mx, mDx);  // increment positions
        mv_new = mv + mDv;                 // increment speeds

        y_new.segment(0, GetNcoords_x()) = mx_new;
        y_new.segment(GetNcoords_x(), GetNcoords_v()) = mv_new;
    
        return;
    }

    throw ChException("StateIncrement() called with a wrong number of elements");
}